

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O0

char * duckdb_get_varchar(duckdb_value value)

{
  long lVar1;
  Value *pVVar2;
  void *__src;
  size_t __n;
  char *result;
  string *str;
  Value str_val;
  Value *val;
  Value *this;
  undefined8 in_stack_ffffffffffffff58;
  LogicalType *in_stack_ffffffffffffff60;
  Value *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff9f;
  LogicalType *in_stack_ffffffffffffffa0;
  Value *in_stack_ffffffffffffffa8;
  
  duckdb::LogicalType::LogicalType
            (in_stack_ffffffffffffff60,(LogicalTypeId)((ulong)in_stack_ffffffffffffff58 >> 0x38));
  duckdb::Value::DefaultCastAs
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
  duckdb::LogicalType::~LogicalType((LogicalType *)0x190f982);
  duckdb::StringValue::Get_abi_cxx11_(in_stack_ffffffffffffff80);
  lVar1 = std::__cxx11::string::size();
  pVVar2 = (Value *)malloc(lVar1 + 1);
  this = pVVar2;
  __src = (void *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::size();
  memcpy(this,__src,__n);
  lVar1 = std::__cxx11::string::size();
  (&(pVVar2->type_).id_)[lVar1] = INVALID;
  duckdb::Value::~Value(this);
  return (char *)pVVar2;
}

Assistant:

char *duckdb_get_varchar(duckdb_value value) {
	auto val = reinterpret_cast<duckdb::Value *>(value);
	auto str_val = val->DefaultCastAs(duckdb::LogicalType::VARCHAR);
	auto &str = duckdb::StringValue::Get(str_val);

	auto result = reinterpret_cast<char *>(malloc(sizeof(char) * (str.size() + 1)));
	memcpy(result, str.c_str(), str.size());
	result[str.size()] = '\0';
	return result;
}